

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O3

int __thiscall LPCMStreamReader::convertWavToPCM(LPCMStreamReader *this,uint8_t *start,uint8_t *end)

{
  uint16_t *end_00;
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  uint16_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  byte bVar10;
  size_t __n;
  long lVar11;
  byte bVar12;
  ushort uVar13;
  int iVar14;
  void *pvVar15;
  uint16_t *puVar16;
  size_t __n_00;
  
  uVar2 = this->m_bitsPerSample;
  __n = 3;
  if (uVar2 != 0x14) {
    __n = (size_t)(uVar2 >> 3);
  }
  __n_00 = __n * this->m_channels;
  uVar9 = (long)end - (long)start;
  if ((long)uVar9 < (long)__n_00) {
    return 0;
  }
  uVar6 = uVar9 - uVar9 % __n_00;
  end_00 = (uint16_t *)(start + uVar6);
  uVar7 = uVar6 / this->m_channels;
  if (uVar2 == 0x10) {
    puVar16 = (uint16_t *)start;
    if (uVar9 != uVar9 % __n_00) {
      do {
        uVar4 = my_ntohs(*puVar16);
        *puVar16 = uVar4;
        puVar16 = puVar16 + 1;
      } while (puVar16 < end_00);
    }
  }
  else if ((0x10 < uVar2) && (puVar16 = (uint16_t *)start, start < end_00 + -1)) {
    do {
      uVar4 = *puVar16;
      *(uint8_t *)puVar16 = (uint8_t)puVar16[1];
      *(uint8_t *)(puVar16 + 1) = (uint8_t)uVar4;
      puVar16 = (uint16_t *)((long)puVar16 + 3);
    } while (puVar16 < end_00 + -1);
  }
  uVar1 = this->m_channels;
  if (uVar1 == '\b') {
    pvVar8 = operator_new__(uVar7);
    uVar9 = (ulong)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar9 = 3;
    }
    iVar3 = (int)uVar9;
    uVar5 = 8;
    if ((long)(ulong)(uint)(iVar3 * 3) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + (uint)(iVar3 * 3));
      pvVar15 = pvVar8;
      do {
        if (iVar3 != 0) {
          uVar7 = 0;
          do {
            *(uint8_t *)((long)pvVar15 + uVar7) = *(uint8_t *)((long)puVar16 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          pvVar15 = (void *)((long)pvVar15 + uVar7);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)(uint)(iVar3 * 8));
      } while (puVar16 < end_00);
      uVar5 = (uint)this->m_channels;
    }
    copyChannelData(this,start,(uint8_t *)end_00,7,4,uVar5);
    copyChannelData(this,start,(uint8_t *)end_00,8,7,(uint)this->m_channels);
    uVar5 = (uint)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar5 = 3;
    }
    if ((long)(ulong)(uVar5 * 7) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + uVar5 * 7);
      bVar10 = this->m_channels;
      pvVar15 = pvVar8;
      do {
        if (uVar5 != 0) {
          uVar9 = 0;
          do {
            *(uint8_t *)((long)puVar16 + uVar9) = *(uint8_t *)((long)pvVar15 + uVar9);
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
          pvVar15 = (void *)((long)pvVar15 + uVar9);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)(bVar10 * uVar5));
      } while (puVar16 < end_00);
    }
  }
  else if (uVar1 == '\a') {
    pvVar8 = operator_new__(uVar7);
    uVar9 = (ulong)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar9 = 3;
    }
    iVar3 = (int)uVar9;
    uVar5 = 7;
    if ((long)(ulong)(uint)(iVar3 * 3) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + (uint)(iVar3 * 3));
      pvVar15 = pvVar8;
      do {
        if (iVar3 != 0) {
          uVar7 = 0;
          do {
            *(uint8_t *)((long)pvVar15 + uVar7) = *(uint8_t *)((long)puVar16 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          pvVar15 = (void *)((long)pvVar15 + uVar7);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)(uint)(iVar3 * 7));
      } while (puVar16 < end_00);
      uVar5 = (uint)this->m_channels;
    }
    copyChannelData(this,start,(uint8_t *)end_00,6,4,uVar5);
    copyChannelData(this,start,(uint8_t *)end_00,5,6,(uint)this->m_channels);
    uVar5 = (uint)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar5 = 3;
    }
    if ((long)(ulong)(uVar5 * 4) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + uVar5 * 4);
      bVar10 = this->m_channels;
      pvVar15 = pvVar8;
      do {
        if (uVar5 != 0) {
          uVar9 = 0;
          do {
            *(uint8_t *)((long)puVar16 + uVar9) = *(uint8_t *)((long)pvVar15 + uVar9);
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
          pvVar15 = (void *)((long)pvVar15 + uVar9);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)(bVar10 * uVar5));
      } while (puVar16 < end_00);
    }
  }
  else {
    if (uVar1 != '\x06') goto LAB_0019241a;
    pvVar8 = operator_new__(uVar7);
    uVar9 = (ulong)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar9 = 3;
    }
    iVar3 = (int)uVar9;
    uVar5 = 6;
    if ((long)(ulong)(uint)(iVar3 * 3) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + (uint)(iVar3 * 3));
      pvVar15 = pvVar8;
      do {
        if (iVar3 != 0) {
          uVar7 = 0;
          do {
            *(uint8_t *)((long)pvVar15 + uVar7) = *(uint8_t *)((long)puVar16 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          pvVar15 = (void *)((long)pvVar15 + uVar7);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)(uint)(iVar3 * 6));
      } while (puVar16 < end_00);
      uVar5 = (uint)this->m_channels;
    }
    copyChannelData(this,start,(uint8_t *)end_00,5,4,uVar5);
    copyChannelData(this,start,(uint8_t *)end_00,6,5,(uint)this->m_channels);
    uVar9 = (ulong)(this->m_bitsPerSample >> 3);
    if (this->m_bitsPerSample == 0x14) {
      uVar9 = 3;
    }
    iVar3 = (int)uVar9;
    if ((long)(ulong)(uint)(iVar3 * 5) < (long)uVar6) {
      puVar16 = (uint16_t *)(start + (uint)(iVar3 * 5));
      bVar10 = this->m_channels;
      pvVar15 = pvVar8;
      do {
        if (iVar3 != 0) {
          uVar7 = 0;
          do {
            *(uint8_t *)((long)puVar16 + uVar7) = *(uint8_t *)((long)pvVar15 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          pvVar15 = (void *)((long)pvVar15 + uVar7);
        }
        puVar16 = (uint16_t *)((long)puVar16 + (ulong)((uint)bVar10 * iVar3));
      } while (puVar16 < end_00);
    }
  }
  operator_delete__(pvVar8);
LAB_0019241a:
  lVar11 = (ulong)this->m_needPCMHdr * 4 + 0xdf;
  if (0 < (long)uVar6) {
    do {
      memcpy((void *)((long)&(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                             super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader + lVar11)
             ,start,__n_00);
      lVar11 = lVar11 + __n_00;
      if ((this->m_channels & 1) != 0) {
        memset((void *)((long)&(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader +
                       lVar11),0,__n);
        lVar11 = lVar11 + __n;
      }
      start = (uint8_t *)((long)start + __n_00);
    } while (start < end_00);
    if (0x4462 < lVar11) {
      __assert_fail("dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                    ,0xf7,"int LPCMStreamReader::convertWavToPCM(uint8_t *, uint8_t *)");
    }
  }
  if (this->m_needPCMHdr == true) {
    uVar2 = this->m_bitsPerSample;
    uVar5 = 0x18;
    if (uVar2 != 0x14) {
      uVar5 = (uint)uVar2;
    }
    iVar3 = this->m_freq;
    iVar14 = (uint)(this->m_channels + 1 & 0xfe) * uVar5 * iVar3;
    uVar13 = (short)(uint)((ulong)((long)iVar14 * 0x51eb851f) >> 0x29) - (short)(iVar14 >> 0x1f);
    *(ushort *)this->m_tmpFrameBuffer = uVar13 * 0x100 | uVar13 >> 8;
    switch(this->m_channels) {
    case '\x02':
      bVar10 = 3;
      break;
    case '\x03':
      bVar10 = this->m_lfeExists | 4;
      break;
    case '\x04':
      bVar10 = this->m_lfeExists ^ 7;
      break;
    case '\x05':
      bVar10 = 8;
      break;
    case '\x06':
      bVar10 = 9;
      break;
    case '\a':
      bVar10 = 10;
      break;
    case '\b':
      bVar10 = 0xb;
      break;
    default:
      bVar10 = 1;
    }
    bVar12 = 4;
    if (iVar3 != 96000) {
      bVar12 = (iVar3 == 0x2ee00) * '\x04' + 1;
    }
    this->m_tmpFrameBuffer[2] = bVar10 << 4 | bVar12;
    uVar5 = (uint)(byte)((char)uVar2 - 9);
    if (-1 < (int)(uVar2 - 0xc)) {
      uVar5 = uVar2 - 0xc;
    }
    this->m_tmpFrameBuffer[3] = ((byte)uVar5 & 0xc) << 4 | this->m_firstFrame << 5;
  }
  return (int)lVar11 + -0xdf;
}

Assistant:

int LPCMStreamReader::convertWavToPCM(uint8_t* start, uint8_t* end)
{
    // int mch = m_channels; // + (m_channels%2==1 ? 1 : 0);
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = m_channels * ch1SampleSize;
    if (end - start < fullSampleSize)
        return 0;
    int64_t cLen = end - start;
    cLen -= cLen % fullSampleSize;
    end = start + cLen;

    const int64_t ch1FullSize = (end - start) / m_channels;
    // 1. convert byte order to little endian
    if (m_bitsPerSample == 16)
    {
        for (auto curPos = reinterpret_cast<uint16_t*>(start); curPos < reinterpret_cast<uint16_t*>(end); ++curPos)
            *curPos = my_htons(*curPos);
    }
    else if (m_bitsPerSample > 16)
    {
        for (uint8_t* curPos = start; curPos < end - 2; curPos += 3)
        {
            const uint8_t tmp = curPos[0];
            curPos[0] = curPos[2];
            curPos[2] = tmp;
        }
    }
    // 2. Remap channels to Blu-ray standard
    if (m_channels == 6)
    {
        const auto tmpData = new uint8_t[ch1FullSize];
        storeChannelData(start, end, 4, tmpData, m_channels);    // copy channel 6(LFE) to tmpData
        copyChannelData(start, end, 5, 4, m_channels);           // Shift RS
        copyChannelData(start, end, 6, 5, m_channels);           // Shift LS
        restoreChannelData(start, end, 6, tmpData, m_channels);  // copy LFE to channel #4
        delete[] tmpData;
    }
    else if (m_channels == 7)
    {
        const auto tmpData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, tmpData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 6, 4, m_channels);
        copyChannelData(start, end, 5, 6, m_channels);
        restoreChannelData(start, end, 5, tmpData, m_channels);

        delete[] tmpData;
    }
    else if (m_channels == 8)
    {
        const auto lfeData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, lfeData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 7, 4, m_channels);
        copyChannelData(start, end, 8, 7, m_channels);
        restoreChannelData(start, end, 8, lfeData, m_channels);

        delete[] lfeData;
    }
    // 3. transfer to frame buffer and Add X channel (zero channel for padding if needed)
    uint8_t* dst = m_tmpFrameBuffer + (m_needPCMHdr ? 4 : 0);
    const uint8_t* src = start;
    for (; src < end; src += fullSampleSize)
    {
        memcpy(dst, src, fullSampleSize);
        dst += fullSampleSize;
        if (m_channels % 2 == 1)
        {
            memset(dst, 0, ch1SampleSize);
            dst += ch1SampleSize;
        }
    }
    assert(dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer));
    // 4. add LPCM frame header
    if (m_needPCMHdr)
    {
        const int audio_data_payload_size = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq *
                                            ((m_channels + 1) & 0xfe) / 8 / 200;  // 5 ms frame len. 1000/5 = 200
        // int audio_data_payload_size = dst - (m_tmpFrameBuffer + 4);
        m_tmpFrameBuffer[0] = static_cast<uint8_t>(audio_data_payload_size >> 8);
        m_tmpFrameBuffer[1] = audio_data_payload_size & 0xff;
        int channelsIndex = 1;
        switch (m_channels)
        {
        case 2:
            channelsIndex = 3;
            break;
        case 3:
            channelsIndex = 4 + (m_lfeExists ? 1 : 0);
            break;
        case 4:
            channelsIndex = 6 + (m_lfeExists ? 0 : 1);
            break;
        case 5:
            channelsIndex = 8;
            break;
        case 6:
            channelsIndex = 9;
            break;
        case 7:
            channelsIndex = 10;
            break;
        case 8:
            channelsIndex = 11;
            break;
        default:;
        }
        int sampling_index = 1;
        if (m_freq == 96000)
            sampling_index = 4;
        else if (m_freq == 192000)
            sampling_index = 5;
        m_tmpFrameBuffer[2] = (channelsIndex << 4 | sampling_index) & 0xff;
        const int bits_per_sample = (m_bitsPerSample - 12) / 4;
        m_tmpFrameBuffer[3] = (bits_per_sample << 6 | m_firstFrame << 5) & 0xff;
    }
    return static_cast<int>(dst - m_tmpFrameBuffer);
}